

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmGeneratorTarget *this;
  pointer pbVar1;
  char *pcVar2;
  bool value;
  bool bVar3;
  bool value_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar5;
  pointer ppcVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  ostream *poVar8;
  bool bVar9;
  bool bVar10;
  string report;
  string reportEntry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  ostringstream e;
  string local_270;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *local_250;
  char *local_248 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  char *local_1f0;
  pointer local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  value = cmGeneratorTarget::GetPropertyAsBool(tgt,p);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1e0,tgt);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_1e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_1e0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar10 = _Var4._M_current !=
           local_1e0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  if (bVar3 && _Var4._M_current !=
               local_1e0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xf5e,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar5 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar5->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_270," * Target \"",(allocator *)&local_1a8);
    std::__cxx11::string::append((string *)&local_270);
    if (_Var4._M_current !=
        local_1e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&local_270);
      valueAsString<bool>((string *)&local_1a8,value);
      std::__cxx11::string::append((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::append((char *)&local_270);
    local_1f0 = defaultValue;
    std::operator+(&local_1c8,"INTERFACE_",p);
    ppcVar6 = (pvVar5->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_250 = pvVar5;
    while (ppcVar6 !=
           (pvVar5->
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           )._M_impl.super__Vector_impl_data._M_finish) {
      this = *ppcVar6;
      local_1e8 = ppcVar6;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_208,this);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_208.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_208.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_1c8);
      pbVar1 = local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      value_00 = cmGeneratorTarget::GetPropertyAsBool(this,&local_1c8);
      local_228._M_string_length = 0;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228.field_2._M_local_buf[0] = '\0';
      bVar9 = value;
      if (_Var7._M_current == pbVar1) {
        if (bVar3) {
          bVar9 = false;
        }
        pvVar5 = local_250;
        if (_Var4._M_current !=
            local_1e0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar9 = value;
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_228);
        pvVar5 = local_250;
        std::__cxx11::string::append((string *)&local_228);
        std::__cxx11::string::append((char *)&local_228);
        valueAsString<bool>((string *)&local_1a8,value_00);
        std::__cxx11::string::append((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_228);
        if (_Var4._M_current ==
            local_1e0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar3) {
            std::__cxx11::string::append((string *)&local_270);
            compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,false);
            std::__cxx11::string::append((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_1a8);
            if (value_00) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              pcVar2 = local_1f0;
              poVar8 = std::operator<<(&local_1a8,"Property ");
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," on target \"");
              poVar8 = std::operator<<(poVar8,(string *)&tgt->Target->Name);
              poVar8 = std::operator<<(poVar8,"\" is\nimplied to be ");
              poVar8 = std::operator<<(poVar8,pcVar2);
              poVar8 = std::operator<<(poVar8,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," property on\ndependency \"");
              poVar8 = std::operator<<(poVar8,(string *)&this->Target->Name);
              std::operator<<(poVar8,"\" is in conflict.\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(local_248[0],(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string((string *)local_248);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              value = false;
              goto LAB_0039abf9;
            }
            bVar9 = false;
          }
          else if (bVar10) {
            std::__cxx11::string::append((string *)&local_270);
            compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,false);
            std::__cxx11::string::append((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_1a8);
            bVar10 = true;
            if (value_00 != value) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              poVar8 = std::operator<<(&local_1a8,"The INTERFACE_");
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," property of \"");
              poVar8 = std::operator<<(poVar8,(string *)&this->Target->Name);
              poVar8 = std::operator<<(poVar8,"\" does\nnot agree with the value of ");
              poVar8 = std::operator<<(poVar8,(string *)p);
              poVar8 = std::operator<<(poVar8," already determined\nfor \"");
              poVar8 = std::operator<<(poVar8,(string *)&tgt->Target->Name);
              std::operator<<(poVar8,"\".\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(local_248[0],(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_0039aad8;
            }
          }
          else {
            std::operator+((string *)&local_1a8,&local_228,"(Interface set)\n");
            std::__cxx11::string::append((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_1a8);
            bVar10 = true;
            bVar9 = value_00;
          }
        }
        else {
          std::__cxx11::string::append((string *)&local_270);
          compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,false);
          std::__cxx11::string::append((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_1a8);
          if (value_00 != value) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            poVar8 = std::operator<<(&local_1a8,"Property ");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," on target \"");
            poVar8 = std::operator<<(poVar8,(string *)&tgt->Target->Name);
            poVar8 = std::operator<<(poVar8,"\" does\nnot match the INTERFACE_");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," property requirement\nof dependency \"");
            poVar8 = std::operator<<(poVar8,(string *)&this->Target->Name);
            std::operator<<(poVar8,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(local_248[0],(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0039aad8:
            std::__cxx11::string::~string((string *)local_248);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_0039abf9:
            std::__cxx11::string::~string((string *)&local_228);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_208);
            break;
          }
        }
      }
      value = bVar9;
      std::__cxx11::string::~string((string *)&local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_208);
      ppcVar6 = local_1e8 + 1;
    }
    valueAsString<bool>((string *)&local_1a8,value);
    compatibilityType_abi_cxx11_(&local_228,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,(string *)&local_1a8,&local_270,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  return value;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  for (std::vector<cmGeneratorTarget const*>::const_iterator li = deps.begin();
       li != deps.end(); ++li) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
      getTypedProperty<PropertyType>(theTarget, interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p << " property requirement\nof "
                    "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}